

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O2

int amqp_encode_properties(uint16_t class_id,void *decoded,amqp_bytes_t encoded)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  size_t o;
  ulong uVar10;
  ulong local_38;
  
  pvVar6 = encoded.bytes;
  uVar9 = encoded.len;
  uVar2 = *decoded;
  uVar1 = 1;
  uVar8 = uVar2;
  do {
    uVar7 = uVar1;
    if (uVar9 < uVar7 + 1) {
      return -2;
    }
    uVar1 = uVar7 + 2;
    *(ushort *)((long)pvVar6 + (uVar7 - 1)) =
         ((ushort)(0xffff < uVar8) | (ushort)uVar8 & 0xfffe) << 8 | (ushort)uVar8 >> 8;
    bVar4 = 0xffff < uVar8;
    uVar8 = uVar8 >> 0x10;
  } while (bVar4);
  if ((((class_id != 0x5a) && (class_id != 0x14)) && (class_id != 0x1e)) &&
     ((class_id != 0x28 && (class_id != 0x32)))) {
    if (class_id == 0x3c) {
      uVar10 = uVar7 + 1;
      local_38 = uVar7 + 1;
      if ((short)uVar2 < 0) {
        if (0xff < *(ulong *)((long)decoded + 8)) {
          return -2;
        }
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + uVar7 + 1) = (char)*(ulong *)((long)decoded + 8);
        sVar3 = *(size_t *)((long)decoded + 8);
        uVar10 = uVar1;
        local_38 = uVar1;
        if (sVar3 != 0) {
          uVar10 = sVar3 + uVar1;
          if (uVar9 < uVar10) {
            return -2;
          }
          local_38 = uVar10;
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x10),sVar3);
        }
      }
      if ((uVar2 >> 0xe & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x18)) {
          return -2;
        }
        uVar1 = uVar10 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + uVar10) = (char)*(ulong *)((long)decoded + 0x18);
        sVar3 = *(size_t *)((long)decoded + 0x18);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x20),sVar3);
        }
      }
      if (((uVar2 >> 0xd & 1) != 0) &&
         (iVar5 = amqp_encode_table(encoded,(amqp_table_t *)((long)decoded + 0x28),&local_38),
         iVar5 < 0)) {
        return iVar5;
      }
      if ((uVar2 >> 0xc & 1) != 0) {
        if (uVar9 < local_38 + 1) {
          return -2;
        }
        *(undefined1 *)((long)pvVar6 + local_38) = *(undefined1 *)((long)decoded + 0x38);
        local_38 = local_38 + 1;
      }
      if ((uVar2 >> 0xb & 1) != 0) {
        if (uVar9 < local_38 + 1) {
          return -2;
        }
        *(undefined1 *)((long)pvVar6 + local_38) = *(undefined1 *)((long)decoded + 0x39);
        local_38 = local_38 + 1;
      }
      if ((uVar2 >> 10 & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x40)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0x40);
        sVar3 = *(size_t *)((long)decoded + 0x40);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x48),sVar3);
        }
      }
      if ((uVar2 >> 9 & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x50)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0x50);
        sVar3 = *(size_t *)((long)decoded + 0x50);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x58),sVar3);
        }
      }
      if ((uVar2 >> 8 & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x60)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0x60);
        sVar3 = *(size_t *)((long)decoded + 0x60);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x68),sVar3);
        }
      }
      if ((char)uVar2 < '\0') {
        if (0xff < *(ulong *)((long)decoded + 0x70)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0x70);
        sVar3 = *(size_t *)((long)decoded + 0x70);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x78),sVar3);
        }
      }
      if ((uVar2 & 0x40) != 0) {
        uVar1 = *(ulong *)((long)decoded + 0x80);
        if (uVar9 < local_38 + 8) {
          return -2;
        }
        *(ulong *)((long)pvVar6 + local_38) =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        local_38 = local_38 + 8;
      }
      if ((uVar2 & 0x20) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x88)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0x88);
        sVar3 = *(size_t *)((long)decoded + 0x88);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0x90),sVar3);
        }
      }
      if ((uVar2 & 0x10) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x98)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0x98);
        sVar3 = *(size_t *)((long)decoded + 0x98);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0xa0),sVar3);
        }
      }
      if ((uVar2 & 8) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0xa8)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0xa8);
        sVar3 = *(size_t *)((long)decoded + 0xa8);
        local_38 = uVar1;
        if (sVar3 != 0) {
          local_38 = sVar3 + uVar1;
          if (uVar9 < local_38) {
            return -2;
          }
          memcpy((void *)(uVar1 + (long)pvVar6),*(void **)((long)decoded + 0xb0),sVar3);
        }
      }
      if ((uVar2 & 4) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0xb8)) {
          return -2;
        }
        uVar1 = local_38 + 1;
        if (uVar9 < uVar1) {
          return -2;
        }
        *(char *)((long)pvVar6 + local_38) = (char)*(ulong *)((long)decoded + 0xb8);
        sVar3 = *(size_t *)((long)decoded + 0xb8);
        local_38 = uVar1;
        if (sVar3 != 0) {
          uVar7 = sVar3 + uVar1;
          if (uVar9 < uVar7) {
            return -2;
          }
          local_38 = uVar7;
          memcpy((void *)((long)pvVar6 + uVar1),*(void **)((long)decoded + 0xc0),sVar3);
          local_38 = uVar7;
        }
      }
      return (int)local_38;
    }
    if ((class_id != 0x55) && (class_id != 10)) {
      return -3;
    }
  }
  return (int)uVar1 + -1;
}

Assistant:

int amqp_encode_properties(uint16_t class_id, void *decoded,
                           amqp_bytes_t encoded) {
  size_t offset = 0;

  /* Cheat, and get the flags out generically, relying on the
     similarity of structure between classes */
  amqp_flags_t flags = *(amqp_flags_t *)decoded; /* cheating! */

  {
    /* We take a copy of flags to avoid destroying it, as it is used
       in the autogenerated code below. */
    amqp_flags_t remaining_flags = flags;
    do {
      amqp_flags_t remainder = remaining_flags >> 16;
      uint16_t partial_flags = remaining_flags & 0xFFFE;
      if (remainder != 0) {
        partial_flags |= 1;
      }
      if (!amqp_encode_16(encoded, &offset, partial_flags))
        return AMQP_STATUS_BAD_AMQP_DATA;
      remaining_flags = remainder;
    } while (remaining_flags != 0);
  }

  switch (class_id) {
    case 10: {
      return (int)offset;
    }
    case 20: {
      return (int)offset;
    }
    case 30: {
      return (int)offset;
    }
    case 40: {
      return (int)offset;
    }
    case 50: {
      return (int)offset;
    }
    case 60: {
      amqp_basic_properties_t *p = (amqp_basic_properties_t *)decoded;
      if (flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        if (UINT8_MAX < p->content_type.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->content_type.len) ||
            !amqp_encode_bytes(encoded, &offset, p->content_type))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
        if (UINT8_MAX < p->content_encoding.len ||
            !amqp_encode_8(encoded, &offset,
                           (uint8_t)p->content_encoding.len) ||
            !amqp_encode_bytes(encoded, &offset, p->content_encoding))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_HEADERS_FLAG) {
        {
          int res = amqp_encode_table(encoded, &(p->headers), &offset);
          if (res < 0) return res;
        }
      }
      if (flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
        if (!amqp_encode_8(encoded, &offset, p->delivery_mode))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_PRIORITY_FLAG) {
        if (!amqp_encode_8(encoded, &offset, p->priority))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
        if (UINT8_MAX < p->correlation_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->correlation_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->correlation_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_REPLY_TO_FLAG) {
        if (UINT8_MAX < p->reply_to.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->reply_to.len) ||
            !amqp_encode_bytes(encoded, &offset, p->reply_to))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_EXPIRATION_FLAG) {
        if (UINT8_MAX < p->expiration.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->expiration.len) ||
            !amqp_encode_bytes(encoded, &offset, p->expiration))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
        if (UINT8_MAX < p->message_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->message_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->message_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TIMESTAMP_FLAG) {
        if (!amqp_encode_64(encoded, &offset, p->timestamp))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TYPE_FLAG) {
        if (UINT8_MAX < p->type.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->type.len) ||
            !amqp_encode_bytes(encoded, &offset, p->type))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_USER_ID_FLAG) {
        if (UINT8_MAX < p->user_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->user_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->user_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_APP_ID_FLAG) {
        if (UINT8_MAX < p->app_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->app_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->app_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
        if (UINT8_MAX < p->cluster_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->cluster_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->cluster_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      return (int)offset;
    }
    case 90: {
      return (int)offset;
    }
    case 85: {
      return (int)offset;
    }
    default:
      return AMQP_STATUS_UNKNOWN_CLASS;
  }
}